

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O1

string * __thiscall
cmCustomCommandGenerator::GetInternalDepfileName
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,string *param_1,
          string *depfile)

{
  pointer pcVar1;
  size_type sVar2;
  uint uVar3;
  string *psVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view input;
  string extension;
  cmCryptoHash hash;
  undefined1 *local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  cmCryptoHash local_98;
  string local_88;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined8 local_58;
  char *local_50;
  size_type local_48;
  pointer local_40;
  char *local_38;
  undefined1 *local_30;
  
  cmCryptoHash::cmCryptoHash(&local_98,AlgoSHA256);
  local_b0 = (char *)0x0;
  local_a8 = 0;
  local_b8 = &local_a8;
  uVar3 = (*this->LG->GlobalGenerator->_vptr_cmGlobalGenerator[0x32])();
  if (uVar3 < 3) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_b8,0,local_b0,
               (ulong)(&DAT_007cf204 + *(int *)(&DAT_007cf204 + (ulong)(uVar3 & 3) * 4)));
  }
  psVar4 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this->LG);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  sVar2 = psVar4->_M_string_length;
  input._M_str = (depfile->_M_dataplus)._M_p;
  input._M_len = depfile->_M_string_length;
  cmCryptoHash::HashString_abi_cxx11_(&local_88,&local_98,input);
  local_58 = 0xe;
  local_50 = "/CMakeFiles/d/";
  local_48 = local_88._M_string_length;
  local_40 = local_88._M_dataplus._M_p;
  local_38 = local_b0;
  local_30 = local_b8;
  views._M_len = 4;
  views._M_array = &local_68;
  local_68._M_len = sVar2;
  local_68._M_str = pcVar1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  cmCryptoHash::~cmCryptoHash(&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetInternalDepfileName(
  const std::string& /*config*/, const std::string& depfile)
{
  cmCryptoHash hash(cmCryptoHash::AlgoSHA256);
  std::string extension;
  switch (*this->LG->GetGlobalGenerator()->DepfileFormat()) {
    case cmDepfileFormat::GccDepfile:
    case cmDepfileFormat::MakeDepfile:
      extension = ".d";
      break;
    case cmDepfileFormat::MSBuildAdditionalInputs:
      extension = ".AdditionalInputs";
      break;
  }
  return cmStrCat(this->LG->GetBinaryDirectory(), "/CMakeFiles/d/",
                  hash.HashString(depfile), extension);
}